

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexical.h
# Opt level: O1

int __thiscall Procedure::getAdr(Procedure *this,string *name,int *adr)

{
  long lVar1;
  pointer pDVar2;
  pointer __s2;
  size_t sVar3;
  size_t __n;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int *piVar8;
  bool bVar9;
  
  pDVar2 = (this->nameTable).super__Vector_base<Description,_std::allocator<Description>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(this->nameTable).super__Vector_base<Description,_std::allocator<Description>_>.
                _M_impl.super__Vector_impl_data._M_finish - (long)pDVar2;
  bVar9 = lVar5 == 0;
  if (!bVar9) {
    lVar5 = lVar5 >> 4;
    uVar6 = lVar5 * -0x5555555555555555;
    __s2 = (name->_M_dataplus)._M_p;
    sVar3 = name->_M_string_length;
    piVar8 = &pDVar2->adr;
    uVar7 = 1;
    do {
      __n = *(size_t *)(piVar8 + -7);
      if ((__n == sVar3) &&
         (((__n == 0 ||
           (iVar4 = bcmp((((Description *)(piVar8 + -9))->name)._M_dataplus._M_p,__s2,__n),
           iVar4 == 0)) && (piVar8[-1] == 1)))) {
        *adr = *piVar8;
        break;
      }
      bVar9 = uVar6 < uVar7 || uVar6 - uVar7 == 0;
      piVar8 = piVar8 + 0xc;
      lVar1 = (lVar5 * 0x5555555555555555 - (ulong)(uVar6 == 0)) + uVar7;
      uVar7 = uVar7 + 1;
    } while (lVar1 != 0);
  }
  return -(uint)bVar9;
}

Assistant:

int getAdr(const std::string &name, int &adr) {
		for (auto i = 0; i < nameTable.size(); i++) {
			if (nameTable[i].name == name) {
				if (nameTable[i].kind != 1) continue;
				adr = nameTable[i].adr;
				return 0;
			}
		}
		return -1;
	}